

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O2

String * __thiscall
Diligent::ParserErrorMessage_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,char *Message,Char *pBuffer,
          Char *pBufferEnd,char *pCurrPos)

{
  Char *c;
  char *pcVar1;
  ostream *poVar2;
  Char *pBufferEnd_local;
  Char *pBuffer_local;
  string local_1d0;
  stringstream Stream;
  ostream local_1a0 [376];
  
  for (pcVar1 = Message; pcVar1 < pBufferEnd; pcVar1 = pcVar1 + 1) {
  }
  pBufferEnd_local = pBuffer;
  pBuffer_local = Message;
  std::__cxx11::stringstream::stringstream((stringstream *)&Stream);
  poVar2 = std::operator<<(local_1a0,"[");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"]: ");
  poVar2 = std::operator<<(poVar2,(char *)this);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  Parsing::GetContext<char_const*>
            (&local_1d0,(Parsing *)&pBuffer_local,&pBufferEnd_local,(char **)pBufferEnd,(char *)0x1,
             (size_t)pCurrPos);
  std::operator<<(poVar2,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&Stream);
  return __return_storage_ptr__;
}

Assistant:

static String ParserErrorMessage(const char* Message, const Char* pBuffer, const Char* pBufferEnd, const char* pCurrPos)
{
    size_t      Line       = 0;
    const auto* pLineStart = pBuffer;
    for (const auto* c = pBuffer; c < pCurrPos; ++c)
    {
        if (*c == '\n')
        {
            ++Line;
            pLineStart = c;
        }
    }
    size_t LineOffset = pCurrPos - pLineStart;

    std::stringstream Stream;
    Stream << "[" << Line << "," << LineOffset << "]: " << Message << std::endl
           << GetContext(pBuffer, pBufferEnd, pCurrPos, 1);
    return Stream.str();
}